

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall ast::Conditional_expression::evaluate(Conditional_expression *this)

{
  Expression *pEVar1;
  uint16_t uVar2;
  uint uVar3;
  Value_type VVar4;
  allocator local_41;
  string local_40;
  Value_type local_1c;
  Conditional_expression *pCStack_18;
  Value_type logical_type;
  Conditional_expression *this_local;
  
  pCStack_18 = this;
  uVar3 = (*this->logical_expression->_vptr_Expression[3])();
  if ((uVar3 & 1) == 0) {
    (this->super_Expression).type = INVALID;
    this_local._7_1_ = false;
  }
  else {
    local_1c = Expression::get_type(this->logical_expression);
    if (local_1c == ABSOLUTE) {
      uVar2 = Expression::get_value(this->logical_expression);
      if (uVar2 == 0) {
        uVar3 = (*this->false_expression->_vptr_Expression[3])();
        if ((uVar3 & 1) == 0) {
          (this->super_Expression).type = INVALID;
          this_local._7_1_ = false;
        }
        else {
          VVar4 = Expression::get_type(this->false_expression);
          (this->super_Expression).type = VVar4;
          uVar2 = Expression::get_value(this->false_expression);
          (this->super_Expression).value = (uint)uVar2;
          this_local._7_1_ = true;
        }
      }
      else {
        uVar3 = (*this->true_expression->_vptr_Expression[3])();
        if ((uVar3 & 1) == 0) {
          (this->super_Expression).type = INVALID;
          this_local._7_1_ = false;
        }
        else {
          VVar4 = Expression::get_type(this->true_expression);
          (this->super_Expression).type = VVar4;
          uVar2 = Expression::get_value(this->true_expression);
          (this->super_Expression).value = (uint)uVar2;
          this_local._7_1_ = true;
        }
      }
    }
    else {
      pEVar1 = this->logical_expression;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"Most be an absolute expression",&local_41);
      error_report(&pEVar1->location,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      (this->super_Expression).type = INVALID;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Conditional_expression::evaluate()
{
	if (!logical_expression->evaluate()) {
		type = INVALID;
		return false;
	}
	auto logical_type = logical_expression->get_type();
	if (logical_type != ABSOLUTE) {
		error_report(&logical_expression->location, "Most be an absolute expression");
		type = INVALID;
		return false;
	}
	if (logical_expression->get_value() != 0) {
		if (!true_expression->evaluate()) {
			type = INVALID;
			return false;
		}
		type = true_expression->get_type();
		value = true_expression->get_value();
		return true;
	}
	else {
		if (!false_expression->evaluate()) {
			type = INVALID;
			return false;
		}
		type = false_expression->get_type();
		value = false_expression->get_value();
		return true;
	}
}